

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O0

void __thiscall ProjectWriter::writeReservoirs(ProjectWriter *this)

{
  double dVar1;
  Node *pNVar2;
  bool bVar3;
  int iVar4;
  _Setw _Var5;
  _Setprecision _Var6;
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  reference ppNVar7;
  ostream *poVar8;
  double dVar9;
  Reservoir *resv;
  Node *node;
  iterator __end1;
  iterator __begin1;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  ProjectWriter *this_local;
  
  std::operator<<((ostream *)&this->field_0x18,"\n[RESERVOIRS]\n");
  this_00 = &this->network->nodes;
  __end1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(this_00);
  node = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(this_00);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                *)&node);
    if (!bVar3) break;
    ppNVar7 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&__end1);
    pNVar2 = *ppNVar7;
    iVar4 = (*(pNVar2->super_Element)._vptr_Element[2])();
    if (iVar4 == 2) {
      poVar8 = (ostream *)std::ostream::operator<<(&this->field_0x18,std::left);
      _Var5 = std::setw(0x10);
      poVar8 = std::operator<<(poVar8,_Var5);
      poVar8 = std::operator<<(poVar8,(string *)&(pNVar2->super_Element).name);
      std::operator<<(poVar8," ");
      _Var5 = std::setw(0xc);
      poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::fixed);
      _Var6 = std::setprecision(4);
      std::operator<<(poVar8,_Var6);
      dVar1 = pNVar2->elev;
      dVar9 = Network::ucf(this->network,LENGTH);
      std::ostream::operator<<(&this->field_0x18,dVar1 * dVar9);
      if (pNVar2[1].super_Element._vptr_Element != (_func_int **)0x0) {
        std::operator<<((ostream *)&this->field_0x18,
                        (string *)(pNVar2[1].super_Element._vptr_Element + 1));
      }
      std::operator<<((ostream *)&this->field_0x18,"\n");
    }
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void ProjectWriter::writeReservoirs()
{
    fout << "\n[RESERVOIRS]\n";
    for (Node* node : network->nodes)
    {
        if ( node->type() == Node::RESERVOIR )
        {
            Reservoir* resv = static_cast<Reservoir*>(node);
            fout << left << setw(16) << node->name << " ";
            fout << setw(12) << fixed << setprecision(4);
            fout << node->elev*network->ucf(Units::LENGTH);
            if ( resv->headPattern )
            {
                fout << resv->headPattern->name;
            }
            fout << "\n";
        }
    }
}